

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cpp
# Opt level: O0

Pattern * compile(Quantifier *q)

{
  P_Sequence *pPVar1;
  Pattern *pPVar2;
  P_QReset *this;
  P_Jump *this_00;
  P_Sequence *tseq;
  Pattern *local_40;
  Pattern *local_38;
  Pattern *local_30;
  Pattern *local_28;
  Pattern *ch;
  P_Sequence *qseq;
  P_Quantifier *pq;
  Quantifier *q_local;
  
  pq = (P_Quantifier *)q;
  pPVar1 = (P_Sequence *)operator_new(0x14);
  P_Quantifier::P_Quantifier((P_Quantifier *)pPVar1);
  qseq = pPVar1;
  pPVar1 = (P_Sequence *)operator_new(0x30);
  P_Sequence::P_Sequence(pPVar1);
  ch = (Pattern *)pPVar1;
  local_28 = compile(*(Pattern **)&pq->maximum);
  *(int *)&qseq->field_0x4 = pq->offset;
  *(PType *)&(qseq->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
             super__Vector_impl_data._M_start = pq[1].type;
  *(byte *)((long)&(qseq->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 4) = (byte)pq[1].minimum & 1;
  *(undefined4 *)
   &(qseq->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 3;
  pPVar2 = ch + 8;
  this = (P_QReset *)operator_new(4);
  P_QReset::P_QReset(this);
  local_30 = rcps<P_QReset>(this);
  std::vector<Pattern_*,_std::allocator<Pattern_*>_>::push_back
            ((vector<Pattern_*,_std::allocator<Pattern_*>_> *)pPVar2,&local_30);
  pPVar2 = ch + 8;
  local_38 = rcps<P_Quantifier>((P_Quantifier *)qseq);
  std::vector<Pattern_*,_std::allocator<Pattern_*>_>::push_back
            ((vector<Pattern_*,_std::allocator<Pattern_*>_> *)pPVar2,&local_38);
  std::vector<Pattern_*,_std::allocator<Pattern_*>_>::push_back
            ((vector<Pattern_*,_std::allocator<Pattern_*>_> *)(ch + 8),&local_28);
  pPVar2 = ch + 8;
  this_00 = (P_Jump *)operator_new(8);
  P_Jump::P_Jump(this_00,-2);
  local_40 = rcps<P_Jump>(this_00);
  std::vector<Pattern_*,_std::allocator<Pattern_*>_>::push_back
            ((vector<Pattern_*,_std::allocator<Pattern_*>_> *)pPVar2,&local_40);
  pPVar1 = PT_dynamic_cast<P_Sequence*>(local_28);
  if (pPVar1 != (P_Sequence *)0x0) {
    pPVar1->parent = (P_Sequence *)ch;
    pPVar1->iparent = 2;
  }
  pPVar2 = rcps<P_Sequence>((P_Sequence *)ch);
  return pPVar2;
}

Assistant:

static Pattern* compile(AST::Quantifier* q) {
    auto* pq = new P_Quantifier;
    auto* qseq = new P_Sequence;
    Pattern* ch = compile(q->child);

    pq->minimum = q->minimum;
    pq->maximum = q->maximum;
    pq->reluctant = q->reluctant;
    pq->offset = 3;

    qseq->v.push_back(rcps(new P_QReset));
    qseq->v.push_back(rcps(pq));
    qseq->v.push_back(ch);
    qseq->v.push_back(rcps(new P_Jump{ -2 }));

    P_Sequence* tseq = PT_dynamic_cast<P_Sequence*>(ch);
    if (tseq) {
        tseq->parent = qseq;
        tseq->iparent = 2;
    }
    return rcps(qseq);
}